

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

Real NormHelper_NVector_MultiFab(N_Vector x,N_Vector w,N_Vector id,int use_id,bool rms)

{
  MultiFab **ppMVar1;
  int in_ECX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  byte in_R8B;
  int ycomp;
  int xcomp;
  Real sum;
  IntVect nghost;
  bool local;
  sunindextype N;
  sunindextype numcomp;
  MultiFab *mf_id;
  MultiFab *mf_y;
  MultiFab *mf_x;
  bool in_stack_00000107;
  anon_class_1_0_00000001 *in_stack_00000108;
  int in_stack_00000114;
  MultiFab *in_stack_00000118;
  int in_stack_00000124;
  MultiFab *in_stack_00000128;
  MultiFab *in_stack_00000130;
  undefined1 in_stack_000001b0 [12];
  anon_class_1_0_00000001 *in_stack_00000230;
  int in_stack_00000238;
  IntVect in_stack_00000240;
  double local_d8;
  double local_d0;
  double local_c8;
  MultiFab *local_c0;
  double local_90;
  int local_88 [2];
  int local_80;
  int local_78 [2];
  int local_70;
  undefined1 local_69;
  sunindextype local_68;
  int local_64;
  MultiFab *local_60;
  MultiFab *local_58;
  FabArrayBase *local_50;
  byte local_45;
  int local_44;
  N_Vector local_40;
  N_Vector local_38;
  N_Vector local_30;
  int local_28 [2];
  int local_20;
  IntVect local_14;
  
  local_45 = in_R8B & 1;
  local_44 = in_ECX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  ppMVar1 = amrex::sundials::getMFptr(in_RDI);
  local_50 = (FabArrayBase *)*ppMVar1;
  ppMVar1 = amrex::sundials::getMFptr(local_38);
  local_58 = *ppMVar1;
  if (local_44 == 0) {
    local_c0 = (MultiFab *)0x0;
  }
  else {
    ppMVar1 = amrex::sundials::getMFptr(local_40);
    local_c0 = *ppMVar1;
  }
  local_60 = local_c0;
  local_64 = amrex::FabArrayBase::nComp(local_50);
  local_68 = N_VGetLength_MultiFab(local_30);
  local_69 = 1;
  amrex::IntVect::IntVect(&local_14,0);
  local_20 = local_14.vect[2];
  local_28[0] = local_14.vect[0];
  local_28[1] = local_14.vect[1];
  local_80 = local_14.vect[2];
  local_88[0] = local_14.vect[0];
  local_88[1] = local_14.vect[1];
  local_78[0] = local_14.vect[0];
  local_78[1] = local_14.vect[1];
  local_70 = local_14.vect[2];
  local_90 = 0.0;
  if (local_44 == 0) {
    local_90 = amrex::NormHelper<NormHelper_NVector_MultiFab::__2>
                         ((MultiFab *)id,use_id,mf_x,mf_y._4_4_,(anon_class_1_0_00000001 *)mf_id,
                          numcomp,(IntVect)in_stack_000001b0,N._3_1_);
  }
  else {
    local_90 = amrex::
               NormHelper<amrex::MultiFab,NormHelper_NVector_MultiFab::__0,NormHelper_NVector_MultiFab::__1>
                         (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000118,
                          in_stack_00000114,in_stack_00000108,in_stack_00000230,in_stack_00000238,
                          in_stack_00000240,in_stack_00000107);
  }
  amrex::ParallelDescriptor::ReduceRealSum<double>(&local_90);
  if ((local_45 & 1) == 0) {
    if (0.0 < local_90) {
      local_d8 = sqrt(local_90);
    }
    else {
      local_d8 = 0.0;
    }
    local_d0 = local_d8;
  }
  else {
    if (0.0 < local_90 / (double)local_68) {
      local_c8 = sqrt(local_90 / (double)local_68);
    }
    else {
      local_c8 = 0.0;
    }
    local_d0 = local_c8;
  }
  return local_d0;
}

Assistant:

amrex::Real NormHelper_NVector_MultiFab(N_Vector x, N_Vector w, N_Vector id, int use_id, bool rms)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    //Call mf_y=mf_w is the MultiFab* from the N_Vector w
    MultiFab *mf_y = amrex::sundials::getMFptr(w);
    MultiFab *mf_id = use_id ? amrex::sundials::getMFptr(id) : NULL;
    sunindextype numcomp = mf_x->nComp();
    sunindextype N = amrex::sundials::N_VGetLength_MultiFab(x);
    bool local = true;
    IntVect nghost = amrex::IntVect::TheZeroVector();
    Real sum = 0;
    int xcomp = 0;
    int ycomp = 0;

    // ghost cells not included
    if(use_id)
        sum = amrex::NormHelper(*mf_id,
                                *mf_x, xcomp,
                                *mf_y, ycomp,
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real m) -> amrex::Real { return m > amrex::Real(0.0); },
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real x, amrex::Real y) -> amrex::Real { return x*x*y*y; },
                                numcomp, nghost, local);
    else
        sum = amrex::NormHelper(*mf_x, xcomp,
                                *mf_y, ycomp,
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real x, amrex::Real y) -> amrex::Real { return x*x*y*y; },
                                numcomp, nghost, local);
    ParallelDescriptor::ReduceRealSum(sum);

    return rms ? SUNRsqrt(sum/N) : SUNRsqrt(sum);
}